

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::UnaryExpr<bool>::streamReconstructedExpression(UnaryExpr<bool> *this,ostream *os)

{
  char *pcVar1;
  ulong uVar2;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  uVar2 = (ulong)(byte)(this->super_ITransientExpression).field_0xa;
  pcVar1 = "freed == false";
  if (uVar2 != 0) {
    pcVar1 = "freed == true";
  }
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,pcVar1 + 9,pcVar1 + 9 + (uVar2 ^ 5));
  std::__ostream_insert<char,std::char_traits<char>>(os,local_38,local_30);
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }